

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalUcs2Little::map_utf8
          (CCharmapToLocalUcs2Little *this,char *dest,size_t dest_len,utf8_ptr src,
          size_t src_byte_len,size_t *src_bytes_used)

{
  char *pcVar1;
  char *pcVar2;
  char *in_RCX;
  ulong in_RDX;
  undefined1 *puVar3;
  undefined1 *in_RSI;
  long in_R8;
  long *in_R9;
  wchar_t unicode_char;
  char *srcend;
  size_t cur_total;
  utf8_ptr src_start;
  undefined4 in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb4;
  size_t local_40;
  utf8_ptr local_38;
  long *local_30;
  long local_28;
  ulong local_20;
  undefined1 *local_18;
  utf8_ptr local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_8.p_ = in_RCX;
  utf8_ptr::utf8_ptr(&local_38);
  local_38.p_ = local_8.p_;
  pcVar1 = utf8_ptr::getptr(&local_8);
  local_40 = 0;
  while (pcVar2 = utf8_ptr::getptr(&local_8), pcVar2 < pcVar1 + local_28) {
    if (local_18 != (undefined1 *)0x0) {
      if (local_20 < 2) break;
      in_stack_ffffffffffffffb4 = utf8_ptr::getch((utf8_ptr *)0x240074);
      puVar3 = local_18 + 1;
      *local_18 = (char)in_stack_ffffffffffffffb4;
      local_18 = local_18 + 2;
      *puVar3 = (char)((uint)in_stack_ffffffffffffffb4 >> 8);
      local_20 = local_20 - 2;
    }
    local_40 = local_40 + 2;
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  if (local_30 != (long *)0x0) {
    pcVar1 = utf8_ptr::getptr(&local_8);
    pcVar2 = utf8_ptr::getptr(&local_38);
    *local_30 = (long)pcVar1 - (long)pcVar2;
  }
  return local_40;
}

Assistant:

size_t CCharmapToLocalUcs2Little::
   map_utf8(char *dest, size_t dest_len,
            utf8_ptr src, size_t src_byte_len,
            size_t *src_bytes_used) const
{
    utf8_ptr src_start;
    size_t cur_total;
    char *srcend;

    /* remember where we started */
    src_start = src;

    /* compute where the source buffer ends */
    srcend = src.getptr() + src_byte_len;

    /* copy characters until we reach the end of the source string */
    for (cur_total = 0 ; src.getptr() < srcend ; src.inc())
    {
        /* 
         *   if we have room, add it; otherwise, zero the output length
         *   remaining so we don't try to add anything more 
         */
        if (dest == 0)
        {
            /* we're just counting - don't store anything */
        }
        else if (dest_len >= 2)
        {
            wchar_t unicode_char;

            /* get the current character */
            unicode_char = src.getch();

            /* add the sequence */
            *dest++ = (unicode_char & 0xff);
            *dest++ = ((unicode_char >> 8) & 0xff);

            /* adjust the length remaining */
            dest_len -= 2;
        }
        else
        {
            /* it doesn't fit - stop now */
            break;
        }

        /* count the length in the total */
        cur_total += 2;
    }

    /* if the caller wants to know how much space we used, tell them */
    if (src_bytes_used != 0)
        *src_bytes_used = src.getptr() - src_start.getptr();

    /* return the total length of the result */
    return cur_total;
}